

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O3

SelectionSet * __thiscall
OpenMD::SelectionEvaluator::hull(SelectionSet *__return_storage_ptr__,SelectionEvaluator *this)

{
  RealType RVar1;
  SelectionSet local_78;
  SelectionSet local_58;
  vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> local_38;
  
  createSelectionSets(&local_78,this);
  HullFinder::findHull(&local_58,&this->hullFinder);
  local_38.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_78.bitsets_.
       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_38.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_78.bitsets_.
       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_38.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_78.bitsets_.
       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_78.bitsets_.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_58.bitsets_.
       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_78.bitsets_.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_58.bitsets_.
       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_78.bitsets_.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_58.bitsets_.
       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_58.bitsets_.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.bitsets_.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.bitsets_.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector(&local_38);
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            (&local_58.bitsets_);
  RVar1 = (this->hullFinder).volume_;
  this->surfaceArea_ = (this->hullFinder).surfaceArea_;
  this->hasSurfaceArea_ = true;
  this->volume_ = RVar1;
  this->hasVolume_ = true;
  SelectionSet::parallelReduce(__return_storage_ptr__,&local_78);
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            (&local_78.bitsets_);
  return __return_storage_ptr__;
}

Assistant:

SelectionSet SelectionEvaluator::hull() {
    SelectionSet bs = createSelectionSets();

    bs              = hullFinder.findHull();
    surfaceArea_    = hullFinder.getSurfaceArea();
    hasSurfaceArea_ = true;
    volume_         = hullFinder.getVolume();
    hasVolume_      = true;

    return bs.parallelReduce();
  }